

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O0

Text __thiscall loguru::get_error_context_for(loguru *this,EcEntryBase *ec_head)

{
  uint uVar1;
  bool bVar2;
  iterator __first;
  reference ppEVar3;
  undefined8 uVar4;
  char *pcVar5;
  Text local_e0;
  Text prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> description;
  EcEntryBase *entry;
  iterator __end2;
  iterator __begin2;
  vector<const_loguru::EcEntryBase_*,_std::allocator<const_loguru::EcEntryBase_*>_> *__range2;
  StringStream result;
  undefined1 local_30 [8];
  vector<const_loguru::EcEntryBase_*,_std::allocator<const_loguru::EcEntryBase_*>_> stack;
  EcEntryBase *ec_head_local;
  
  stack.
  super__Vector_base<const_loguru::EcEntryBase_*,_std::allocator<const_loguru::EcEntryBase_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ec_head;
  std::vector<const_loguru::EcEntryBase_*,_std::allocator<const_loguru::EcEntryBase_*>_>::vector
            ((vector<const_loguru::EcEntryBase_*,_std::allocator<const_loguru::EcEntryBase_*>_> *)
             local_30);
  for (; stack.
         super__Vector_base<const_loguru::EcEntryBase_*,_std::allocator<const_loguru::EcEntryBase_*>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0;
      stack.
      super__Vector_base<const_loguru::EcEntryBase_*,_std::allocator<const_loguru::EcEntryBase_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)stack.
                    super__Vector_base<const_loguru::EcEntryBase_*,_std::allocator<const_loguru::EcEntryBase_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage[4]) {
    std::vector<const_loguru::EcEntryBase_*,_std::allocator<const_loguru::EcEntryBase_*>_>::
    push_back((vector<const_loguru::EcEntryBase_*,_std::allocator<const_loguru::EcEntryBase_*>_> *)
              local_30,(value_type *)
                       &stack.
                        super__Vector_base<const_loguru::EcEntryBase_*,_std::allocator<const_loguru::EcEntryBase_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  __first = std::vector<const_loguru::EcEntryBase_*,_std::allocator<const_loguru::EcEntryBase_*>_>::
            begin((vector<const_loguru::EcEntryBase_*,_std::allocator<const_loguru::EcEntryBase_*>_>
                   *)local_30);
  result.str.field_2._8_8_ =
       std::vector<const_loguru::EcEntryBase_*,_std::allocator<const_loguru::EcEntryBase_*>_>::end
                 ((vector<const_loguru::EcEntryBase_*,_std::allocator<const_loguru::EcEntryBase_*>_>
                   *)local_30);
  std::
  reverse<__gnu_cxx::__normal_iterator<loguru::EcEntryBase_const**,std::vector<loguru::EcEntryBase_const*,std::allocator<loguru::EcEntryBase_const*>>>>
            ((__normal_iterator<const_loguru::EcEntryBase_**,_std::vector<const_loguru::EcEntryBase_*,_std::allocator<const_loguru::EcEntryBase_*>_>_>
              )__first._M_current,
             (__normal_iterator<const_loguru::EcEntryBase_**,_std::vector<const_loguru::EcEntryBase_*,_std::allocator<const_loguru::EcEntryBase_*>_>_>
              )result.str.field_2._8_8_);
  StringStream::StringStream((StringStream *)&__range2);
  bVar2 = std::vector<const_loguru::EcEntryBase_*,_std::allocator<const_loguru::EcEntryBase_*>_>::
          empty((vector<const_loguru::EcEntryBase_*,_std::allocator<const_loguru::EcEntryBase_*>_> *
                )local_30);
  if (!bVar2) {
    std::__cxx11::string::operator+=
              ((string *)&__range2,"------------------------------------------------\n");
    __end2 = std::vector<const_loguru::EcEntryBase_*,_std::allocator<const_loguru::EcEntryBase_*>_>
             ::begin((vector<const_loguru::EcEntryBase_*,_std::allocator<const_loguru::EcEntryBase_*>_>
                      *)local_30);
    entry = (EcEntryBase *)
            std::vector<const_loguru::EcEntryBase_*,_std::allocator<const_loguru::EcEntryBase_*>_>::
            end((vector<const_loguru::EcEntryBase_*,_std::allocator<const_loguru::EcEntryBase_*>_> *
                )local_30);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_loguru::EcEntryBase_**,_std::vector<const_loguru::EcEntryBase_*,_std::allocator<const_loguru::EcEntryBase_*>_>_>
                                  *)&entry);
      if (!bVar2) break;
      ppEVar3 = __gnu_cxx::
                __normal_iterator<const_loguru::EcEntryBase_**,_std::vector<const_loguru::EcEntryBase_*,_std::allocator<const_loguru::EcEntryBase_*>_>_>
                ::operator*(&__end2);
      description.field_2._8_8_ = *ppEVar3;
      pcVar5 = ((EcEntryBase *)description.field_2._8_8_)->_descr;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,pcVar5,(allocator<char> *)((long)&prefix._str + 7));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                     &local_d0,":");
      std::__cxx11::string::~string((string *)&local_d0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&prefix._str + 7));
      pcVar5 = filename(*(char **)(description.field_2._8_8_ + 8));
      uVar1 = *(uint *)(description.field_2._8_8_ + 0x10);
      uVar4 = std::__cxx11::string::c_str();
      textprintf((char *)&local_e0,"[ErrorContext] %*s:%-5u %-20s ",0x17,pcVar5,(ulong)uVar1,uVar4);
      pcVar5 = Text::c_str(&local_e0);
      std::__cxx11::string::operator+=((string *)&__range2,pcVar5);
      (*(code *)**(undefined8 **)description.field_2._8_8_)(description.field_2._8_8_,&__range2);
      std::__cxx11::string::operator+=((string *)&__range2,"\n");
      Text::~Text(&local_e0);
      std::__cxx11::string::~string((string *)local_b0);
      __gnu_cxx::
      __normal_iterator<const_loguru::EcEntryBase_**,_std::vector<const_loguru::EcEntryBase_*,_std::allocator<const_loguru::EcEntryBase_*>_>_>
      ::operator++(&__end2);
    }
    std::__cxx11::string::operator+=
              ((string *)&__range2,"------------------------------------------------");
  }
  pcVar5 = (char *)std::__cxx11::string::c_str();
  pcVar5 = strdup(pcVar5);
  Text::Text((Text *)this,pcVar5);
  StringStream::~StringStream((StringStream *)&__range2);
  std::vector<const_loguru::EcEntryBase_*,_std::allocator<const_loguru::EcEntryBase_*>_>::~vector
            ((vector<const_loguru::EcEntryBase_*,_std::allocator<const_loguru::EcEntryBase_*>_> *)
             local_30);
  return (Text)(char *)this;
}

Assistant:

Text get_error_context_for(const EcEntryBase* ec_head)
	{
		std::vector<const EcEntryBase*> stack;
		while (ec_head) {
			stack.push_back(ec_head);
			ec_head = ec_head->_previous;
		}
		std::reverse(stack.begin(), stack.end());

		StringStream result;
		if (!stack.empty()) {
			result.str += "------------------------------------------------\n";
			for (auto entry : stack) {
				const auto description = std::string(entry->_descr) + ":";
				auto prefix = textprintf("[ErrorContext] %*s:%-5u %-20s ",
					LOGURU_FILENAME_WIDTH, filename(entry->_file), entry->_line, description.c_str());
				result.str += prefix.c_str();
				entry->print_value(result);
				result.str += "\n";
			}
			result.str += "------------------------------------------------";
		}
		return Text(STRDUP(result.str.c_str()));
	}